

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

ssize_t __thiscall AutoFile::write(AutoFile *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  pointer pbVar2;
  void *pvVar3;
  char *pcVar4;
  ptrdiff_t _Num;
  void *__n_00;
  undefined4 in_register_00000034;
  void *pvVar5;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  Span<std::byte> write;
  array<std::byte,_4096UL> buf;
  
  pvVar5 = (void *)CONCAT44(in_register_00000034,__fd);
  buf._M_elems[8] = 0;
  buf._M_elems[9] = 0;
  buf._M_elems[10] = 0;
  buf._M_elems[0xb] = 0;
  buf._M_elems[0xc] = 0;
  buf._M_elems[0xd] = 0;
  buf._M_elems[0xe] = 0;
  buf._M_elems[0xf] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)this->m_file == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    buf._M_elems._8_8_ = std::iostream_category();
    buf._M_elems[0] = 1;
    buf._M_elems[1] = 0;
    buf._M_elems[2] = 0;
    buf._M_elems[3] = 0;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::write: file handle is nullptr");
LAB_00b0d5d9:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if ((this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar5 = (void *)fwrite(pvVar5,1,(size_t)__buf,(FILE *)this->m_file);
      if (pvVar5 != __buf) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"AutoFile::write: write failed");
        goto LAB_00b0d5d9;
      }
      if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value =
             (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value + (long)__buf;
      }
    }
    else {
      if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == false) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"AutoFile::write: position unknown");
        goto LAB_00b0d5d9;
      }
      for (; __buf != (void *)0x0; __buf = (void *)((long)__buf - (long)__n_00)) {
        __n_00 = (void *)0x1000;
        if (__buf < (void *)0x1000) {
          __n_00 = __buf;
        }
        memcpy(&buf,pvVar5,(size_t)__n_00);
        pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
        key.m_size = (long)(this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
        key.m_data = pbVar2;
        write.m_size = (size_t)__n_00;
        write.m_data = buf._M_elems;
        util::Xor(write,key,
                  (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload._M_value);
        pvVar3 = (void *)fwrite(&buf,1,(size_t)__n_00,(FILE *)this->m_file);
        if (pvVar3 != __n_00) {
          pcVar4 = (char *)__cxa_allocate_exception(0x20);
          std::iostream_category();
          std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"XorFile::write: failed");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_00b0d647;
        }
        pvVar5 = (void *)((long)pvVar5 + (long)__n_00);
        (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value =
             (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value + (long)__n_00;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
LAB_00b0d647:
  __stack_chk_fail();
}

Assistant:

void AutoFile::write(Span<const std::byte> src)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::write: file handle is nullptr");
    if (m_xor.empty()) {
        if (std::fwrite(src.data(), 1, src.size(), m_file) != src.size()) {
            throw std::ios_base::failure("AutoFile::write: write failed");
        }
        if (m_position.has_value()) *m_position += src.size();
    } else {
        if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::write: position unknown");
        std::array<std::byte, 4096> buf;
        while (src.size() > 0) {
            auto buf_now{Span{buf}.first(std::min<size_t>(src.size(), buf.size()))};
            std::copy(src.begin(), src.begin() + buf_now.size(), buf_now.begin());
            util::Xor(buf_now, m_xor, *m_position);
            if (std::fwrite(buf_now.data(), 1, buf_now.size(), m_file) != buf_now.size()) {
                throw std::ios_base::failure{"XorFile::write: failed"};
            }
            src = src.subspan(buf_now.size());
            *m_position += buf_now.size();
        }
    }
}